

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcClosedShell::~IfcClosedShell(IfcClosedShell *this)

{
  void *pvVar1;
  
  *(undefined8 *)
   &this[-1].super_IfcConnectedFaceSet.super_IfcTopologicalRepresentationItem.field_0x28 = 0x975ce0;
  *(undefined8 *)
   &(this->super_IfcConnectedFaceSet).super_IfcTopologicalRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x975d58;
  *(undefined8 *)&this[-1].super_IfcConnectedFaceSet.field_0x38 = 0x975d08;
  *(undefined8 *)&this[-1].super_IfcConnectedFaceSet.field_0x48 = 0x975d30;
  pvVar1 = *(void **)&this[-1].super_IfcConnectedFaceSet.field_0x58;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&this[-1].field_0x68 - (long)pvVar1);
  }
  operator_delete(&this[-1].super_IfcConnectedFaceSet.super_IfcTopologicalRepresentationItem.
                   field_0x28,0x70);
  return;
}

Assistant:

IfcClosedShell() : Object("IfcClosedShell") {}